

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<bool_(*)(void_**)>::begin(QList<bool_(*)(void_**)> *this)

{
  _func_bool_void_ptr_ptr **n;
  QArrayDataPointer<bool_(*)(void_**)> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<bool_(*)(void_**)> *)0x237619);
  QArrayDataPointer<bool_(*)(void_**)>::operator->(in_RDI);
  n = QArrayDataPointer<bool_(*)(void_**)>::begin((QArrayDataPointer<bool_(*)(void_**)> *)0x23762a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }